

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.h
# Opt level: O2

Image get_image_from_grid(Grid *grid)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Colori CVar4;
  Image pCVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int newY;
  int iVar12;
  int iVar13;
  int newX;
  long lVar14;
  undefined4 uVar15;
  Colorf col;
  Colorf col_00;
  float local_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uVar16;
  float fVar17;
  
  uVar1 = grid->rows;
  uVar2 = grid->columns;
  iVar3 = uVar1 * uVar2 * 0x3c * 0x3c;
  uVar6 = 0xffffffffffffffff;
  if (-1 < iVar3) {
    uVar6 = (long)iVar3 * 4;
  }
  pCVar5 = (Image)operator_new__(uVar6);
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  iVar3 = 0;
  uVar11 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar11 = 0;
  }
  for (uVar7 = 0; uVar7 != uVar11; uVar7 = uVar7 + 1) {
    iVar9 = iVar3;
    for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      local_9c = 0.0;
      local_98 = 0;
      uStack_94 = 0;
      switch(grid->nodes[uVar7 * (long)(int)uVar2 + uVar8].state) {
      case EMPTY:
      case NEIGHBOUR:
        local_98 = 0x3f800000;
        uStack_94 = 0x3f800000;
        local_9c = 1.0;
        break;
      case ORIGIN:
        local_9c = 0.8;
        break;
      case TARGET:
        local_98 = 0x3f4ccccd;
        uStack_94 = 0;
        break;
      case PATH:
        local_98 = 0;
        uStack_94 = 0x3f266666;
        break;
      case CHECKED:
        local_98 = 0x3f400000;
        uStack_94 = 0x3f800000;
      }
      iVar10 = iVar9;
      for (iVar12 = 0; iVar12 != 0x3c; iVar12 = iVar12 + 1) {
        for (lVar14 = 0; lVar14 != 0x3c; lVar14 = lVar14 + 1) {
          iVar13 = iVar10 + (int)lVar14;
          if (iVar12 - 0x3aU < 0xffffffc8) {
            col.b = 0.15;
            col.r = 0.15;
            col.g = 0.15;
            CVar4 = get_color(col);
            pCVar5[iVar13] = CVar4;
          }
          else {
            uVar15 = local_98;
            uVar16 = uStack_94;
            fVar17 = local_9c;
            if ((int)lVar14 - 0x3aU < 0xffffffc8) {
              uVar15 = 0x3e19999a;
              uVar16 = 0x3e19999a;
              fVar17 = 0.15;
            }
            col_00.g = (float)uVar16;
            col_00.r = (float)uVar15;
            col_00.b = fVar17;
            CVar4 = get_color(col_00);
            pCVar5[iVar13] = CVar4;
          }
        }
        iVar10 = iVar10 + uVar2 * 0x3c;
      }
      iVar9 = iVar9 + 0x3c;
    }
    iVar3 = iVar3 + uVar2 * 0xe10;
  }
  return pCVar5;
}

Assistant:

Image get_image_from_grid(Grid *grid)
{
    int rows = grid->rows;
    int columns = grid->columns;
    int size = GRID_ELEMENT_SIZE;
    int borderSize = GRID_BORDER_SIZE;
    Image img = new Colori[(rows * size) * (columns * size)];
    for (int y = 0; y < rows; y++)
    {
        for (int x = 0; x < columns; x++)
        {
            NODE_STATE state = grid->get_node_from_position(x, y)->state;
            Colorf col(0.0f);
            switch (state)
            {
            case EMPTY:
                col = EMPTY_COLOR;
                break;
            case BLOCKED:
                col = BLOCKED_COLOR;
                break;
            case ORIGIN:
                col = ORIGIN_COLOR;
                break;
            case TARGET:
                col = TARGET_COLOR;
                break;
            case PATH:
                col = PATH_COLOR;
                break;
            case CHECKED:
#if SHOW_PATH_LIST
                col = CHECK_COLOR;
#else
#if SHOW_PATH_NEIGHBOURS
                col = NEIGHBOUR_COLOR;
#else
                col = EMPTY_COLOR;
#endif
#endif
                break;
            case NEIGHBOUR:
#if SHOW_PATH_NEIGHBOURS
                col = NEIGHBOUR_COLOR;
#else
                col = EMPTY_COLOR;
#endif
                break;
            }
            int startX = x * size;
            int startY = y * size;
            for (int newY = 0; newY < size; newY++)
            {
                for (int newX = 0; newX < size; newX++)
                {
                    int index = (startY + newY) * (columns * size) + (startX + newX);
                    if (newY < borderSize / 2 || newY >= (size - (borderSize / 2)))
                    {
                        img[index] = get_color(BORDER_COLOR);
                    }
                    else if (newX < borderSize / 2 || newX >= (size - (borderSize / 2)))
                    {
                        img[index] = get_color(BORDER_COLOR);
                    }
                    else
                    {
                        img[index] = get_color(col);
                    }
                }
            }
        }
    }
    return img;
}